

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O1

string * minja::strip(string *__return_storage_ptr__,string *s,string *chars,bool left,bool right)

{
  pointer pcVar1;
  long lVar2;
  long *local_48 [2];
  long local_38 [2];
  
  local_48[0] = local_38;
  if (chars->_M_string_length == 0) {
    std::__cxx11::string::_M_construct<char_const*>((string *)local_48," \t\n\r","");
  }
  else {
    pcVar1 = (chars->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_48,pcVar1,pcVar1 + chars->_M_string_length);
  }
  if (left) {
    lVar2 = std::__cxx11::string::find_first_not_of((char *)s,(ulong)local_48[0],0);
  }
  else {
    lVar2 = 0;
  }
  if (lVar2 == -1) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  }
  else {
    if (right) {
      std::__cxx11::string::find_last_not_of((char *)s,(ulong)local_48[0],0xffffffffffffffff);
    }
    std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)s);
  }
  if (local_48[0] != local_38) {
    operator_delete(local_48[0],local_38[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string strip(const std::string & s, const std::string & chars = "", bool left = true, bool right = true) {
  auto charset = chars.empty() ? " \t\n\r" : chars;
  auto start = left ? s.find_first_not_of(charset) : 0;
  if (start == std::string::npos) return "";
  auto end = right ? s.find_last_not_of(charset) : s.size() - 1;
  return s.substr(start, end - start + 1);
}